

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s98ml_parse.c
# Opt level: O1

long yytnamerr(char *yyres,char *yystr)

{
  byte bVar1;
  char cVar2;
  long lVar3;
  size_t sVar4;
  char *pcVar5;
  char *pcVar6;
  
  if (*yystr != '\"') {
LAB_001040ce:
    if (yyres != (char *)0x0) {
      lVar3 = -1;
      do {
        cVar2 = yystr[lVar3 + 1];
        yyres[lVar3 + 1] = cVar2;
        lVar3 = lVar3 + 1;
      } while (cVar2 != '\0');
      return lVar3;
    }
    sVar4 = strlen(yystr);
    return sVar4;
  }
  lVar3 = 0;
  pcVar5 = yystr;
  do {
    pcVar6 = pcVar5 + 1;
    bVar1 = pcVar5[1];
    if (bVar1 < 0x5c) {
      if (bVar1 == 0x22) {
        if (yyres == (char *)0x0) {
          return lVar3;
        }
        yyres[lVar3] = '\0';
        return lVar3;
      }
      if ((bVar1 == 0x27) || (bVar1 == 0x2c)) goto LAB_001040ce;
    }
    else if (bVar1 == 0x5c) {
      if (pcVar5[2] != '\\') goto LAB_001040ce;
      pcVar6 = pcVar5 + 2;
    }
    if (yyres != (char *)0x0) {
      yyres[lVar3] = *pcVar6;
    }
    lVar3 = lVar3 + 1;
    pcVar5 = pcVar6;
  } while( true );
}

Assistant:

static YYPTRDIFF_T
yytnamerr (char *yyres, const char *yystr)
{
  if (*yystr == '"')
    {
      YYPTRDIFF_T yyn = 0;
      char const *yyp = yystr;
      for (;;)
        switch (*++yyp)
          {
          case '\'':
          case ',':
            goto do_not_strip_quotes;

          case '\\':
            if (*++yyp != '\\')
              goto do_not_strip_quotes;
            else
              goto append;

          append:
          default:
            if (yyres)
              yyres[yyn] = *yyp;
            yyn++;
            break;

          case '"':
            if (yyres)
              yyres[yyn] = '\0';
            return yyn;
          }
    do_not_strip_quotes: ;
    }

  if (yyres)
    return yystpcpy (yyres, yystr) - yyres;
  else
    return yystrlen (yystr);
}